

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float fVar1;
  ImGuiWindow *this;
  ImVec2 pos;
  ImVec2 IVar2;
  ImVec2 p_min;
  ImVec2 IVar3;
  ImVec2 p_max;
  ImGuiContext *pIVar4;
  ImGuiNextWindowDataFlags IVar5;
  char *text;
  char *text_00;
  bool bVar6;
  ImGuiID id;
  ImGuiID id_00;
  ImU32 IVar7;
  ImU32 col;
  ImDrawFlags IVar8;
  ImGuiContext *g;
  uint uVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  bool hovered;
  bool held;
  ImRect bb;
  ImRect total_bb;
  bool local_e2;
  bool local_e1;
  float local_e0;
  bool local_d9;
  ImRect local_d8;
  undefined1 local_c8 [16];
  ImVec2 local_b0;
  ImGuiNextWindowDataFlags local_a4;
  char *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  char *local_70;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar4 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  local_a4 = (pIVar4->NextWindowData).Flags;
  (pIVar4->NextWindowData).Flags = 0;
  if (this->SkipItems == false) {
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    local_c8 = ZEXT816(0);
    local_e0 = 0.0;
    if ((flags & 0x20U) == 0) {
      local_e0 = GetFrameHeight();
    }
    IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_4_ = IVar2.x;
    local_88._4_4_ = IVar2.y;
    local_88._12_4_ = extraout_XMM0_Dd;
    if (preview_value != (char *)0x0 && (char)flags < '\0') {
      IVar2 = CalcTextSize(preview_value,(char *)0x0,true,-1.0);
      local_c8._8_4_ = extraout_XMM0_Dc_00;
      local_c8._0_4_ = IVar2.x;
      local_c8._4_4_ = IVar2.y;
      local_c8._12_4_ = extraout_XMM0_Dd_00;
    }
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_68 = local_e0;
    if ((flags & 0x40U) == 0) {
      if ((char)flags < '\0') {
        fVar1 = (pIVar4->Style).FramePadding.x;
        uStack_64 = 0;
        uStack_60 = 0;
        uStack_5c = 0;
        local_68 = fVar1 + fVar1 + (float)local_c8._0_4_ + local_e0;
      }
      else {
        local_68 = CalcItemWidth();
        uStack_64 = extraout_XMM0_Db;
        uStack_60 = extraout_XMM0_Dc_01;
        uStack_5c = extraout_XMM0_Dd_01;
      }
    }
    fVar1 = (pIVar4->Style).FramePadding.y;
    local_d8.Min.x = (this->DC).CursorPos.x;
    local_d8.Min.y = (this->DC).CursorPos.y;
    local_d8.Max.x = local_68 + local_d8.Min.x;
    local_d8.Max.y = fVar1 + fVar1 + (float)local_88._4_4_ + local_d8.Min.y;
    local_40.Max.x = 0.0;
    if (0.0 < (float)local_88._0_4_) {
      local_40.Max.x = (pIVar4->Style).ItemInnerSpacing.x + (float)local_88._0_4_;
    }
    local_40.Max.x = local_40.Max.x + local_d8.Max.x;
    local_40.Max.y = local_d8.Max.y + 0.0;
    local_b0.y = local_40.Max.y - local_d8.Min.y;
    local_b0.x = local_40.Max.x - local_d8.Min.x;
    local_a0 = label;
    local_70 = preview_value;
    local_40.Min.x = local_d8.Min.x;
    local_40.Min.y = local_d8.Min.y;
    ItemSize(&local_b0,fVar1);
    bVar6 = ItemAdd(&local_40,id,&local_d8,0);
    if (!bVar6) {
      return false;
    }
    bVar6 = ButtonBehavior(&local_d8,id,&local_e1,&local_d9,0);
    id_00 = ImHashStr("##ComboPopup",0,id);
    local_e2 = IsPopupOpen(id_00,0);
    if ((!local_e2) && (bVar6)) {
      OpenPopupEx(id_00,0);
      local_e2 = true;
    }
    IVar7 = GetColorU32(local_e1 + 7,1.0);
    local_c8 = ZEXT416((uint)local_d8.Min.x);
    local_98 = ZEXT416((uint)local_d8.Max.x);
    RenderNavHighlight(&local_d8,id,0);
    uVar9 = -(uint)((float)local_98._0_4_ - local_e0 <= (float)local_c8._0_4_);
    local_c8._0_4_ = uVar9 & local_c8._0_4_ | ~uVar9 & (uint)((float)local_98._0_4_ - local_e0);
    local_c8._4_4_ = local_98._4_4_ & local_c8._4_4_;
    local_c8._8_4_ = local_98._8_4_ & local_c8._8_4_;
    local_c8._12_4_ = local_98._12_4_ & local_c8._12_4_;
    if ((flags & 0x40U) == 0) {
      local_b0.y = local_d8.Max.y;
      local_b0.x = (float)local_c8._0_4_;
      IVar8 = 0xf0;
      if ((flags & 0x20U) == 0) {
        IVar8 = 0x50;
      }
      ImDrawList::AddRectFilled
                (this->DrawList,&local_d8.Min,&local_b0,IVar7,(pIVar4->Style).FrameRounding,IVar8);
    }
    local_98._0_4_ = id_00;
    if ((flags & 0x20U) == 0) {
      IVar7 = GetColorU32(((byte)(local_e1 | local_e2) & 1) + 0x15,1.0);
      col = GetColorU32(0,1.0);
      local_b0.y = local_d8.Min.y;
      local_b0.x = (float)local_c8._0_4_;
      IVar8 = 0xa0;
      if (local_68 <= local_e0) {
        IVar8 = 0xf0;
      }
      ImDrawList::AddRectFilled
                (this->DrawList,&local_b0,&local_d8.Max,IVar7,(pIVar4->Style).FrameRounding,IVar8);
      if (((float)local_c8._0_4_ + local_e0) - (pIVar4->Style).FramePadding.x <= local_d8.Max.x) {
        fVar1 = (pIVar4->Style).FramePadding.y;
        IVar2.y = fVar1 + local_d8.Min.y;
        IVar2.x = fVar1 + (float)local_c8._0_4_;
        RenderArrow(this->DrawList,IVar2,col,ImGuiDir_Down,1.0);
      }
    }
    p_min.y = local_d8.Min.y;
    p_min.x = local_d8.Min.x;
    p_max.y = local_d8.Max.y;
    p_max.x = local_d8.Max.x;
    RenderFrameBorder(p_min,p_max,(pIVar4->Style).FrameRounding);
    text_00 = local_70;
    text = local_a0;
    IVar5 = local_a4;
    if (((uint)flags >> 0x14 & 1) == 0) {
      if (local_70 != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
        if (pIVar4->LogEnabled == true) {
          LogSetNextTextDecoration("{","}");
        }
        IVar2 = (pIVar4->Style).FramePadding;
        local_b0.x = IVar2.x + local_d8.Min.x;
        local_b0.y = IVar2.y + local_d8.Min.y;
        local_48.x = (float)local_c8._0_4_;
        local_48.y = local_d8.Max.y;
        local_50.x = 0.0;
        local_50.y = 0.0;
        RenderTextClipped(&local_b0,&local_48,text_00,(char *)0x0,(ImVec2 *)0x0,&local_50,
                          (ImRect *)0x0);
      }
    }
    else {
      IVar3.y = local_d8.Min.y;
      IVar3.x = local_d8.Min.x;
      (pIVar4->ComboPreviewData).PreviewRect.Min = IVar3;
      (pIVar4->ComboPreviewData).PreviewRect.Max.x = (float)local_c8._0_4_;
      (pIVar4->ComboPreviewData).PreviewRect.Max.y = local_d8.Max.y;
    }
    if (0.0 < (float)local_88._0_4_) {
      pos.y = (pIVar4->Style).FramePadding.y + local_d8.Min.y;
      pos.x = (pIVar4->Style).ItemInnerSpacing.x + local_d8.Max.x;
      RenderText(pos,text,(char *)0x0,true);
    }
    if (local_e2 != false) {
      (pIVar4->NextWindowData).Flags = IVar5;
      bVar6 = BeginComboPopup(local_98._0_4_,&local_d8,flags);
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    ImGuiNextWindowDataFlags backup_next_window_data_flags = g.NextWindowData.Flags;
    g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together
    if (flags & ImGuiComboFlags_WidthFitPreview)
        IM_ASSERT((flags & (ImGuiComboFlags_NoPreview | (ImGuiComboFlags)ImGuiComboFlags_CustomPreview)) == 0);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float preview_width = ((flags & ImGuiComboFlags_WidthFitPreview) && (preview_value != NULL)) ? CalcTextSize(preview_value, NULL, true).x : 0.0f;
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : ((flags & ImGuiComboFlags_WidthFitPreview) ? (arrow_size + preview_width + style.FramePadding.x * 2.0f) : CalcItemWidth());
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(bb.Min, bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &bb))
        return false;

    // Open on click
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    const ImGuiID popup_id = ImHashStr("##ComboPopup", 0, id);
    bool popup_open = IsPopupOpen(popup_id, ImGuiPopupFlags_None);
    if (pressed && !popup_open)
    {
        OpenPopupEx(popup_id, ImGuiPopupFlags_None);
        popup_open = true;
    }

    // Render shape
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(bb.Min.x, bb.Max.x - arrow_size);
    RenderNavHighlight(bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(bb.Min, ImVec2(value_x2, bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersLeft);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, bb.Min.y), bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersRight);
        if (value_x2 + arrow_size - style.FramePadding.x <= bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(bb.Min, bb.Max, style.FrameRounding);

    // Custom preview
    if (flags & ImGuiComboFlags_CustomPreview)
    {
        g.ComboPreviewData.PreviewRect = ImRect(bb.Min.x, bb.Min.y, value_x2, bb.Max.y);
        IM_ASSERT(preview_value == NULL || preview_value[0] == 0);
        preview_value = NULL;
    }

    // Render preview and label
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
    {
        if (g.LogEnabled)
            LogSetNextTextDecoration("{", "}");
        RenderTextClipped(bb.Min + style.FramePadding, ImVec2(value_x2, bb.Max.y), preview_value, NULL, NULL);
    }
    if (label_size.x > 0)
        RenderText(ImVec2(bb.Max.x + style.ItemInnerSpacing.x, bb.Min.y + style.FramePadding.y), label);

    if (!popup_open)
        return false;

    g.NextWindowData.Flags = backup_next_window_data_flags;
    return BeginComboPopup(popup_id, bb, flags);
}